

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O1

void Commands::Info(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *arguments,Character *from)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  World *pWVar2;
  pointer pbVar3;
  pointer pcVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Character *this;
  mapped_type *this_00;
  PacketBuilder reply;
  string name;
  undefined1 local_118 [48];
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  pWVar2 = from->world;
  pbVar3 = (arguments->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar4 = (pbVar3->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar4,pcVar4 + pbVar3->_M_string_length);
  this = World::GetCharacter(pWVar2,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = local_118 + 0x10;
  local_118._0_8_ = pcVar4;
  if (this == (Character *)0x0) {
    pWVar2 = from->world;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"character_not_found","");
    I18N::Format<>(&local_68,&pWVar2->i18n,(string *)local_118);
    (*(from->super_Command_Source)._vptr_Command_Source[5])(from,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_0012c898:
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
LAB_0012c8a0:
    local_a8._M_dataplus._M_p = (pointer)local_118._0_8_;
    if ((pointer)local_118._0_8_ == pcVar4) {
      return;
    }
    goto LAB_0012cd54;
  }
  uVar5 = (**(this->super_Command_Source)._vptr_Command_Source)(this);
  pWVar2 = from->world;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"cmdprotect","");
  this_00 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar2->admin_config,(key_type *)local_118);
  iVar6 = util::variant::GetInt(this_00);
  if ((int)(uVar5 & 0xff) < iVar6) {
    if ((pointer)local_118._0_8_ != pcVar4) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
  }
  else {
    iVar6 = (**(this->super_Command_Source)._vptr_Command_Source)(this);
    iVar7 = (**(from->super_Command_Source)._vptr_Command_Source)(from);
    if ((pointer)local_118._0_8_ != pcVar4) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    if ((byte)iVar7 < (byte)iVar6) {
      pWVar2 = from->world;
      local_118._0_8_ = pcVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_118,"command_access_denied","");
      I18N::Format<>(&local_88,&pWVar2->i18n,(string *)local_118);
      (*(from->super_Command_Source)._vptr_Command_Source[5])(from,&local_88);
      local_68.field_2._M_allocated_capacity = local_88.field_2._M_allocated_capacity;
      local_68._M_dataplus._M_p = local_88._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) goto LAB_0012c898;
      goto LAB_0012c8a0;
    }
  }
  (*(this->super_Command_Source)._vptr_Command_Source[2])(local_118,this);
  util::ucfirst(&local_a8,(string *)local_118);
  if ((pointer)local_118._0_8_ != pcVar4) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  PacketBuilder::PacketBuilder
            ((PacketBuilder *)local_118,PACKET_ADMININTERACT,PACKET_TELL,
             local_a8._M_string_length + 0x55);
  switch(this->admin) {
  case ADMIN_GUIDE:
    pWVar2 = from->world;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"light_guide_title","");
    I18N::Format<std::__cxx11::string&>(&local_e8,&pWVar2->i18n,&local_c8,&local_a8);
    PacketBuilder::AddString((PacketBuilder *)local_118,&local_e8);
    break;
  case ADMIN_GUARDIAN:
    pWVar2 = from->world;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"guardian_title","");
    I18N::Format<std::__cxx11::string&>(&local_e8,&pWVar2->i18n,&local_c8,&local_a8);
    PacketBuilder::AddString((PacketBuilder *)local_118,&local_e8);
    break;
  case ADMIN_GM:
    pWVar2 = from->world;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"game_master_title","");
    I18N::Format<std::__cxx11::string&>(&local_e8,&pWVar2->i18n,&local_c8,&local_a8);
    PacketBuilder::AddString((PacketBuilder *)local_118,&local_e8);
    break;
  case ADMIN_HGM:
    pWVar2 = from->world;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"high_game_master_title","")
    ;
    I18N::Format<std::__cxx11::string&>(&local_e8,&pWVar2->i18n,&local_c8,&local_a8);
    PacketBuilder::AddString((PacketBuilder *)local_118,&local_e8);
    break;
  default:
    PacketBuilder::AddString((PacketBuilder *)local_118,&local_a8);
    goto LAB_0012cac1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
LAB_0012cac1:
  paVar1 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8," ","");
  PacketBuilder::AddString((PacketBuilder *)local_118,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  Character::PaddedGuildTag_abi_cxx11_(&local_c8,this);
  util::trim(&local_e8,&local_c8);
  PacketBuilder::AddBreakString((PacketBuilder *)local_118,&local_e8,0xff);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  iVar6 = Character::Usage(this);
  PacketBuilder::AddInt((PacketBuilder *)local_118,iVar6);
  PacketBuilder::AddByte((PacketBuilder *)local_118,0xff);
  PacketBuilder::AddByte((PacketBuilder *)local_118,0xff);
  PacketBuilder::AddInt((PacketBuilder *)local_118,this->exp);
  PacketBuilder::AddChar((PacketBuilder *)local_118,(uint)this->level);
  PacketBuilder::AddShort((PacketBuilder *)local_118,(int)this->mapid);
  PacketBuilder::AddShort((PacketBuilder *)local_118,(uint)this->x);
  PacketBuilder::AddShort((PacketBuilder *)local_118,(uint)this->y);
  PacketBuilder::AddShort((PacketBuilder *)local_118,this->hp);
  PacketBuilder::AddShort((PacketBuilder *)local_118,this->maxhp);
  PacketBuilder::AddShort((PacketBuilder *)local_118,this->tp);
  PacketBuilder::AddShort((PacketBuilder *)local_118,this->maxtp);
  PacketBuilder::AddShort((PacketBuilder *)local_118,*this->display_str);
  PacketBuilder::AddShort((PacketBuilder *)local_118,*this->display_intl);
  PacketBuilder::AddShort((PacketBuilder *)local_118,*this->display_wis);
  PacketBuilder::AddShort((PacketBuilder *)local_118,*this->display_agi);
  PacketBuilder::AddShort((PacketBuilder *)local_118,*this->display_con);
  PacketBuilder::AddShort((PacketBuilder *)local_118,*this->display_cha);
  PacketBuilder::AddShort((PacketBuilder *)local_118,this->maxdam);
  PacketBuilder::AddShort((PacketBuilder *)local_118,this->mindam);
  PacketBuilder::AddShort((PacketBuilder *)local_118,this->accuracy);
  PacketBuilder::AddShort((PacketBuilder *)local_118,this->evade);
  PacketBuilder::AddShort((PacketBuilder *)local_118,this->armor);
  PacketBuilder::AddShort((PacketBuilder *)local_118,0);
  PacketBuilder::AddShort((PacketBuilder *)local_118,0);
  PacketBuilder::AddShort((PacketBuilder *)local_118,0);
  PacketBuilder::AddShort((PacketBuilder *)local_118,0);
  PacketBuilder::AddShort((PacketBuilder *)local_118,0);
  PacketBuilder::AddShort((PacketBuilder *)local_118,0);
  PacketBuilder::AddChar((PacketBuilder *)local_118,this->weight);
  PacketBuilder::AddChar((PacketBuilder *)local_118,this->maxweight);
  Character::Send(from,(PacketBuilder *)local_118);
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_118);
  local_118._16_8_ = local_a8.field_2._M_allocated_capacity;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
    return;
  }
LAB_0012cd54:
  operator_delete(local_a8._M_dataplus._M_p,local_118._16_8_ + 1);
  return;
}

Assistant:

void Info(const std::vector<std::string>& arguments, Character* from)
{
	Character *victim = from->world->GetCharacter(arguments[0]);

	if (!victim)
	{
		from->ServerMsg(from->world->i18n.Format("character_not_found"));
	}
	else
	{
		if (victim->SourceAccess() < int(from->world->admin_config["cmdprotect"])
		 || victim->SourceAccess() <= from->SourceAccess())
		{
			std::string name = util::ucfirst(victim->SourceName());

			PacketBuilder reply(PACKET_ADMININTERACT, PACKET_TELL, 85 + name.length());

			switch (victim->admin)
			{
				case ADMIN_HGM:      reply.AddString(from->world->i18n.Format("high_game_master_title", name)); break;
				case ADMIN_GM:       reply.AddString(from->world->i18n.Format("game_master_title", name)); break;
				case ADMIN_GUARDIAN: reply.AddString(from->world->i18n.Format("guardian_title", name)); break;
				case ADMIN_GUIDE:    reply.AddString(from->world->i18n.Format("light_guide_title", name)); break;
				default:             reply.AddString(name);
			}

			reply.AddString(" ");
			reply.AddBreakString(util::trim(victim->PaddedGuildTag()));
			reply.AddInt(victim->Usage());
			reply.AddByte(255);
			reply.AddByte(255);
			reply.AddInt(victim->exp);
			reply.AddChar(victim->level);
			reply.AddShort(victim->mapid);
			reply.AddShort(victim->x);
			reply.AddShort(victim->y);
			reply.AddShort(victim->hp);
			reply.AddShort(victim->maxhp);
			reply.AddShort(victim->tp);
			reply.AddShort(victim->maxtp);
			reply.AddShort(victim->display_str);
			reply.AddShort(victim->display_intl);
			reply.AddShort(victim->display_wis);
			reply.AddShort(victim->display_agi);
			reply.AddShort(victim->display_con);
			reply.AddShort(victim->display_cha);
			reply.AddShort(victim->maxdam);
			reply.AddShort(victim->mindam);
			reply.AddShort(victim->accuracy);
			reply.AddShort(victim->evade);
			reply.AddShort(victim->armor);
			reply.AddShort(0); // light
			reply.AddShort(0); // dark
			reply.AddShort(0); // fire
			reply.AddShort(0); // water
			reply.AddShort(0); // earth
			reply.AddShort(0); // wind
			reply.AddChar(victim->weight);
			reply.AddChar(victim->maxweight);

			from->Send(reply);
		}
		else
		{
			from->ServerMsg(from->world->i18n.Format("command_access_denied"));
		}
	}
}